

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  undefined1 *puVar2;
  uchar uVar3;
  byte bVar4;
  connectdata *pcVar5;
  sockaddr *psVar6;
  curl_trc_feat *pcVar7;
  _Bool _Var8;
  ushort uVar9;
  CURLcode CVar10;
  uint uVar11;
  int iVar12;
  resolve_t rVar13;
  connect_t cVar14;
  CURLproxycode CVar15;
  socks_state *sx;
  long lVar16;
  size_t __n;
  ssize_t sVar17;
  size_t __n_00;
  int code;
  ulong uVar18;
  Curl_addrinfo *pCVar19;
  char *pcVar20;
  char *pcVar21;
  CURLproxycode in_R8D;
  Curl_dns_entry **entry;
  size_t sVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  Curl_dns_entry *dns;
  size_t local_98;
  Curl_cfilter *local_90;
  connectdata *local_88;
  _Bool *local_80;
  uchar ip4 [4];
  undefined4 uStack_74;
  undefined8 uStack_70;
  
  local_80 = done;
  if ((cf->field_0x24 & 1) != 0) {
    CVar10 = CURLE_OK;
    _Var8 = true;
    goto LAB_0015921a;
  }
  sx = (socks_state *)cf->ctx;
  pcVar5 = cf->conn;
  iVar12 = cf->sockindex;
  CVar10 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  local_90 = cf;
  local_88 = pcVar5;
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  if (sx->state == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar16 = 0xf0;
    if (((((ulong)local_88->bits & 1) == 0) &&
        (lVar16 = 0x98, (SUB84(local_88->bits,0) >> 8 & 1) == 0)) && (lVar16 = 0x68, iVar12 == 1)) {
      lVar16 = 0x80;
    }
    sx->hostname = *(char **)((long)&(local_88->cpool_node)._list + lVar16);
    if (((ulong)local_88->bits & 1) == 0) {
      if (iVar12 == 1) {
        uVar11 = (uint)local_88->secondary_port;
      }
      else if ((SUB84(local_88->bits,0) >> 9 & 1) == 0) {
        uVar11 = local_88->remote_port;
      }
      else {
        uVar11 = local_88->conn_to_port;
      }
    }
    else {
      uVar11 = (local_88->http_proxy).port;
    }
    sx->remote_port = uVar11;
    sx->proxy_user = (local_88->socks_proxy).user;
    sx->proxy_password = (local_88->socks_proxy).passwd;
  }
  pcVar5 = cf->conn;
  uVar3 = (pcVar5->socks_proxy).proxytype;
  switch(uVar3) {
  case '\x04':
  case '\x06':
    puVar1 = sx->buffer;
    dns = (Curl_dns_entry *)0x0;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      pcVar5->ip_version = '\x01';
      if ((((data != (Curl_easy *)0x0) && (((ulong)pcVar5->bits & 1) != 0)) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        pcVar21 = "";
        if (uVar3 == '\x06') {
          pcVar21 = "a";
        }
        in_R8D = sx->remote_port;
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar21,sx->hostname);
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
      iVar12 = sx->remote_port;
      uVar9 = (ushort)iVar12;
      sx->buffer[0] = '\x04';
      sx->buffer[1] = '\x01';
      *(ushort *)(sx->buffer + 2) = uVar9 << 8 | uVar9 >> 8;
      if (uVar3 == '\x06') {
        if (sx->state != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
        goto switchD_001592ad_caseD_9;
      }
      entry = &dns;
      rVar13 = Curl_resolv(data,sx->hostname,iVar12,true,entry);
      in_R8D = (CURLproxycode)entry;
      if (rVar13 == CURLRESOLV_ERROR) {
        in_R8D = CURLPX_RESOLVE_HOST;
        bVar24 = false;
      }
      else if (rVar13 == CURLRESOLV_PENDING) {
        if (sx->state != CONNECT_RESOLVING) {
          sx->state = CONNECT_RESOLVING;
        }
        if (data != (Curl_easy *)0x0) {
          bVar24 = false;
          in_R8D = CURLPX_OK;
          if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0015989d;
          pcVar7 = (data->state).feat;
          if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
            Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
          }
        }
        bVar24 = false;
        in_R8D = CURLPX_OK;
      }
      else {
        bVar24 = true;
        if (sx->state != CONNECT_RESOLVED) {
          sx->state = CONNECT_RESOLVED;
        }
      }
LAB_0015989d:
      CVar15 = in_R8D;
      if (bVar24) goto switchD_001592ad_caseD_b;
      goto LAB_00159b7b;
    default:
      goto switchD_001592ad_caseD_2;
    case CONNECT_SOCKS_READ:
      goto switchD_001592ad_caseD_4;
    case CONNECT_REQ_INIT:
      goto switchD_001592ad_caseD_9;
    case CONNECT_RESOLVING:
      goto switchD_001592ad_caseD_a;
    case CONNECT_RESOLVED:
      goto switchD_001592ad_caseD_b;
    case CONNECT_REQ_SENDING:
      goto switchD_001592ad_caseD_e;
    }
  case '\x05':
  case '\a':
    pcVar21 = sx->hostname;
    __n = strlen(pcVar21);
    bVar4 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    sVar22 = 0;
    if (0xf < sx->state - CONNECT_SOCKS_INIT) goto switchD_001593f1_caseD_5;
    puVar1 = sx->buffer;
    CVar15 = in_R8D;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      if (((data != (Curl_easy *)0x0) && (((ulong)pcVar5->bits & 1) != 0)) &&
         ((((data->set).field_0x8cd & 0x10) != 0 &&
          ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))
          ))) {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar21,
                   (ulong)(uint)sx->remote_port);
      }
      if ((uVar3 == '\x05') || (__n < 0x100)) {
        if ((((bVar4 & 0xfa) != 0 && data != (Curl_easy *)0x0) &&
            (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar4);
        }
        if ((bVar4 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
        }
        sx->buffer[0] = '\x05';
        sx->buffer[2] = '\0';
        if (sx->proxy_user == (char *)0x0) {
          sVar17 = 3;
        }
        else {
          sx->buffer[3] = '\x02';
          sVar17 = 4;
        }
        sx->buffer[1] = (char)sVar17 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar17;
        CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar15 != CURLPX_OK) goto LAB_0015a5db;
        if (sx->outstanding == 0) {
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
          goto switchD_001593f1_caseD_3;
        }
        goto LAB_0015a5d4;
      }
      Curl_failf(data,
                 "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                );
      CVar15 = CURLPX_LONG_HOSTNAME;
      goto LAB_0015a5db;
    case CONNECT_SOCKS_SEND:
      CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar15 != CURLPX_OK) goto LAB_0015a5db;
      if (sx->outstanding == 0) goto switchD_001593f1_caseD_3;
      goto LAB_0015a5a6;
    case CONNECT_SOCKS_READ_INIT:
switchD_001593f1_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
    case CONNECT_SOCKS_READ:
      in_R8D = 0x17dd03;
      CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
      if (CVar15 != CURLPX_OK) goto LAB_0015a5db;
      if (sx->outstanding != 0) goto LAB_0015a5d4;
      if (*puVar1 != '\x05') {
        pcVar21 = "Received invalid version in initial SOCKS5 response.";
        goto LAB_0015a4d8;
      }
      bVar4 = sx->buffer[1];
      if (1 < bVar4) {
        if (bVar4 != 2) {
          if (bVar4 != 0xff) goto LAB_00159d60;
          Curl_failf(data,"No authentication method was acceptable.");
          CVar15 = CURLPX_NO_AUTH;
          goto LAB_0015a5db;
        }
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_001593f1_caseD_6:
        pcVar21 = sx->proxy_user;
        if ((pcVar21 == (char *)0x0) || (pcVar20 = sx->proxy_password, pcVar20 == (char *)0x0)) {
          __n_00 = 0;
          uVar18 = 0;
        }
        else {
          local_98 = strlen(pcVar21);
          __n_00 = strlen(pcVar20);
          uVar18 = local_98;
        }
        sx->buffer[0] = '\x01';
        sx->buffer[1] = (uchar)uVar18;
        if (uVar18 == 0 || pcVar21 == (char *)0x0) {
LAB_00159e78:
          in_R8D = (CURLproxycode)pcVar21;
          sx->buffer[uVar18 + 2] = (uchar)__n_00;
          sVar22 = uVar18 + 3;
          if (__n_00 != 0 && sx->proxy_password != (char *)0x0) {
            local_98 = sVar22;
            if (0xff < __n_00) {
              Curl_failf(data,"Excessive password length for proxy auth");
              in_R8D = CURLPX_LONG_PASSWD;
              sVar22 = local_98;
              goto LAB_00159ee0;
            }
            memcpy(puVar1 + sVar22,sx->proxy_password,__n_00);
            sVar22 = local_98;
          }
          sVar22 = sVar22 + __n_00;
          if (sx->state != CONNECT_AUTH_SEND) {
            sx->state = CONNECT_AUTH_SEND;
          }
          sx->outstanding = sVar22;
          sx->outp = puVar1;
          bVar24 = true;
        }
        else {
          if (uVar18 < 0x100) {
            local_98 = uVar18;
            memcpy(sx->buffer + 2,pcVar21,uVar18);
            uVar18 = local_98;
            goto LAB_00159e78;
          }
          Curl_failf(data,"Excessive username length for proxy auth");
          in_R8D = CURLPX_LONG_USER;
          sVar22 = 2;
LAB_00159ee0:
          bVar24 = false;
        }
        CVar15 = in_R8D;
        if (!bVar24) goto LAB_0015a5db;
switchD_001593f1_caseD_7:
        local_98 = sVar22;
        CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
        if (CVar15 != CURLPX_OK) goto LAB_0015a5db;
        if (sx->outstanding == 0) {
          sx->outp = puVar1;
          sx->outstanding = 2;
          sVar22 = local_98;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_001593f1_caseD_8:
          local_98 = sVar22;
          CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (CVar15 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0015a5d4;
            if (sx->buffer[1] == '\0') {
              cVar14 = sx->state;
              sVar22 = local_98;
              goto joined_r0x0015a01f;
            }
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar15 = CURLPX_USER_REJECTED;
          }
          goto LAB_0015a5db;
        }
        goto LAB_0015a5a6;
      }
      if (bVar4 == 0) {
        sVar22 = 0;
        cVar14 = sx->state;
joined_r0x0015a01f:
        if (cVar14 != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
switchD_001593f1_caseD_9:
        CVar15 = in_R8D;
        if (uVar3 == '\x05') {
          rVar13 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
          if (rVar13 == CURLRESOLV_ERROR) {
            in_R8D = CURLPX_RESOLVE_HOST;
            bVar24 = false;
          }
          else {
            bVar24 = rVar13 != CURLRESOLV_PENDING;
            if (bVar24) {
              cVar14 = CONNECT_RESOLVED;
              bVar25 = sx->state == CONNECT_RESOLVED;
            }
            else {
              cVar14 = CONNECT_RESOLVING;
              bVar25 = sx->state == CONNECT_RESOLVING;
              in_R8D = CURLPX_OK;
            }
            if (!bVar25) {
              sx->state = cVar14;
            }
          }
          CVar15 = in_R8D;
          if (bVar24) break;
          goto LAB_0015a5db;
        }
switchD_001593f1_caseD_c:
        sx->buffer[0] = '\x05';
        sx->buffer[1] = '\x01';
        sx->buffer[2] = '\0';
        sVar22 = 3;
        if (uVar3 != '\x05') {
          if (((pcVar5->bits).field_0x1 & 4) == 0) {
            iVar12 = inet_pton(2,sx->hostname,ip4);
            if (iVar12 == 1) {
              sx->buffer[3] = '\x01';
              *(uchar (*) [4])(sx->buffer + 4) = ip4;
              sVar22 = 8;
            }
            else {
              sx->buffer[3] = '\x03';
              sx->buffer[4] = (uchar)__n;
              memcpy(sx->buffer + 5,sx->hostname,__n);
              sVar22 = __n + 5;
            }
LAB_0015a167:
            bVar24 = true;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                         (ulong)(uint)sx->remote_port);
            }
          }
          else {
            iVar12 = inet_pton(10,sx->hostname,ip4);
            if (iVar12 == 1) {
              sx->buffer[3] = '\x04';
              *(ulong *)(sx->buffer + 4) = CONCAT44(uStack_74,ip4);
              *(undefined8 *)(sx->buffer + 0xc) = uStack_70;
              sVar22 = 0x14;
              goto LAB_0015a167;
            }
            CVar15 = CURLPX_BAD_ADDRESS_TYPE;
            sVar22 = 3;
            bVar24 = false;
          }
          if (!bVar24) goto LAB_0015a5db;
        }
        goto switchD_001593f1_caseD_d;
      }
      if (bVar4 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        CVar15 = CURLPX_GSSAPI_PERMSG;
      }
      else {
LAB_00159d60:
        Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
        CVar15 = CURLPX_UNKNOWN_MODE;
      }
      goto LAB_0015a5db;
    case CONNECT_GSSAPI_INIT:
      goto switchD_001593f1_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_001593f1_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_001593f1_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_001593f1_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_001593f1_caseD_9;
    case CONNECT_RESOLVING:
      dns = Curl_fetch_addr(data,pcVar21,sx->remote_port);
      if (dns != (Curl_dns_entry *)0x0) {
        (data->state).async.dns = dns;
        puVar2 = &(data->state).async.field_0x28;
        *puVar2 = *puVar2 | 1;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
        }
      }
      if (dns == (Curl_dns_entry *)0x0) {
        CVar10 = Curl_resolv_check(data,&dns);
        if (dns == (Curl_dns_entry *)0x0) {
          CVar15 = CURLPX_RESOLVE_HOST;
          if (CVar10 == CURLE_OK) {
            CVar15 = CURLPX_OK;
          }
          goto LAB_0015a5db;
        }
        sVar22 = 0;
      }
      else {
        sVar22 = 0;
      }
      break;
    case CONNECT_RESOLVE_REMOTE:
      goto switchD_001593f1_caseD_c;
    case CONNECT_REQ_SEND:
      goto switchD_001593f1_caseD_d;
    case CONNECT_REQ_SENDING:
      goto switchD_001593f1_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_001593f1_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_001593f1_caseD_10;
    }
    if (dns == (Curl_dns_entry *)0x0) {
      pCVar19 = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar19 = dns->addr;
    }
    uVar3 = (data->set).ipver;
    if ((uVar3 != '\0') && (pCVar19 != (Curl_addrinfo *)0x0)) {
      do {
        if (pCVar19->ai_family == (uint)(uVar3 != '\x01') * 8 + 2) break;
        pCVar19 = pCVar19->ai_next;
      } while (pCVar19 != (Curl_addrinfo *)0x0);
    }
    if (pCVar19 == (Curl_addrinfo *)0x0) {
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
      in_R8D = CURLPX_RESOLVE_HOST;
    }
    else {
      Curl_printable_address(pCVar19,(char *)ip4,0x2e);
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      if (pCVar19->ai_family == 10) {
        sx->buffer[3] = '\x04';
        psVar6 = pCVar19->ai_addr;
        lVar16 = 0;
        do {
          sx->buffer[lVar16 + 4] = psVar6->sa_data[lVar16 + 6];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) {
          sVar22 = 0x14;
        }
        else {
          sVar22 = 0x14;
          pcVar7 = (data->state).feat;
          if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
            uVar11 = sx->remote_port;
            pcVar21 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_0015a39b:
            Curl_infof(data,pcVar21,ip4,(ulong)uVar11);
          }
        }
      }
      else if (pCVar19->ai_family == 2) {
        sx->buffer[3] = '\x01';
        psVar6 = pCVar19->ai_addr;
        lVar16 = 0;
        do {
          sx->buffer[lVar16 + 4] = psVar6->sa_data[lVar16 + 2];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) {
          sVar22 = 8;
        }
        else {
          sVar22 = 8;
          pcVar7 = (data->state).feat;
          if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
            uVar11 = sx->remote_port;
            pcVar21 = "SOCKS5 connect to %s:%d (locally resolved)";
            goto LAB_0015a39b;
          }
        }
      }
      else {
        Curl_failf(data,"SOCKS5 connection to %s not supported",ip4);
        sVar22 = 3;
      }
      Curl_resolv_unlink(data,&dns);
    }
    CVar15 = in_R8D;
    if (pCVar19 != (Curl_addrinfo *)0x0) {
switchD_001593f1_caseD_d:
      sx->buffer[sVar22] = *(uchar *)((long)&sx->remote_port + 1);
      sx->buffer[sVar22 + 1] = (uchar)sx->remote_port;
      sx->outp = puVar1;
      sx->outstanding = sVar22 + 2;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
switchD_001593f1_caseD_e:
      CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
      if (CVar15 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 10;
          sx->outp = puVar1;
          if (sx->state != CONNECT_REQ_READ) {
            sx->state = CONNECT_REQ_READ;
          }
switchD_001593f1_caseD_f:
          CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
          if (CVar15 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0015a5d4;
            if (*puVar1 == '\x05') {
              bVar4 = sx->buffer[1];
              if (bVar4 == 0) {
                uVar3 = sx->buffer[3];
                if (uVar3 == '\x01') {
                  lVar16 = 10;
                }
                else if (uVar3 == '\x04') {
                  lVar16 = 0x16;
                }
                else {
                  if (uVar3 != '\x03') {
                    Curl_failf(data,"SOCKS5 reply has wrong address type.");
                    cf = local_90;
                    CVar15 = CURLPX_BAD_ADDRESS_TYPE;
                    goto LAB_0015a5db;
                  }
                  lVar16 = (ulong)sx->buffer[4] + 7;
                }
                cf = local_90;
                if ((uint)lVar16 < 0xb) {
                  cVar14 = sx->state;
                }
                else {
                  sx->outstanding = lVar16 + -10;
                  sx->outp = sx->buffer + 10;
                  if (sx->state != CONNECT_REQ_READ_MORE) {
                    sx->state = CONNECT_REQ_READ_MORE;
                  }
switchD_001593f1_caseD_10:
                  CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                            "SOCKS5 connect request address");
                  if (CVar15 != CURLPX_OK) goto LAB_0015a5db;
                  if (sx->outstanding != 0) goto LAB_0015a5d4;
                  cVar14 = sx->state;
                }
                if (cVar14 != CONNECT_DONE) {
                  sx->state = CONNECT_DONE;
                }
switchD_001593f1_caseD_5:
                if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) {
LAB_0015a5a6:
                  CVar15 = CURLPX_OK;
                }
                else {
                  pcVar7 = (data->state).feat;
                  if ((pcVar7 == (curl_trc_feat *)0x0) ||
                     (CVar15 = CURLPX_OK, 0 < pcVar7->log_level)) {
                    Curl_infof(data,"SOCKS5 request granted.");
                    goto LAB_0015a5d4;
                  }
                }
              }
              else {
                Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,
                           (ulong)bVar4);
                CVar15 = CURLPX_REPLY_UNASSIGNED;
                if (bVar4 < 9) {
                  CVar15 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar4 * 4);
                }
              }
            }
            else {
              pcVar21 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_0015a4d8:
              Curl_failf(data,pcVar21);
              CVar15 = CURLPX_BAD_VERSION;
            }
          }
        }
        else {
LAB_0015a5d4:
          CVar15 = CURLPX_OK;
        }
      }
    }
LAB_0015a5db:
    CVar10 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar15 = CURLPX_OK;
    CVar10 = CURLE_COULDNT_CONNECT;
  }
LAB_0015a5dd:
  if (CVar15 != CURLPX_OK) {
    (data->info).pxcode = CVar15;
    CVar10 = CURLE_PROXY;
  }
  if ((CVar10 == CURLE_OK) && (sx->state == CONNECT_DONE)) {
    cf->field_0x24 = cf->field_0x24 | 1;
    Curl_verboseconnect(data,local_88,cf->sockindex);
    if (cf->ctx != (void *)0x0) {
      (*Curl_cfree)(cf->ctx);
      cf->ctx = (void *)0x0;
    }
  }
  _Var8 = (_Bool)(cf->field_0x24 & 1);
LAB_0015921a:
  *local_80 = _Var8;
  return CVar10;
switchD_001592ad_caseD_a:
  dns = Curl_fetch_addr(data,sx->hostname,(pcVar5->primary).remote_port);
  if (dns == (Curl_dns_entry *)0x0) {
    CVar10 = Curl_resolv_check(data,&dns);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar15 = CURLPX_RESOLVE_HOST;
      if (CVar10 == CURLE_OK) {
        CVar15 = CURLPX_OK;
      }
      goto LAB_00159b7b;
    }
  }
  else {
    (data->state).async.dns = dns;
    puVar2 = &(data->state).async.field_0x28;
    *puVar2 = *puVar2 | 1;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
    }
    if (sx->state != CONNECT_RESOLVED) {
      sx->state = CONNECT_RESOLVED;
    }
  }
switchD_001592ad_caseD_b:
  if (dns == (Curl_dns_entry *)0x0) {
    pcVar21 = sx->hostname;
    pcVar20 = "Failed to resolve \"%s\" for SOCKS4 connect.";
  }
  else {
    for (pCVar19 = dns->addr; pCVar19 != (Curl_addrinfo *)0x0; pCVar19 = pCVar19->ai_next) {
      if (pCVar19->ai_family == 2) {
        Curl_printable_address(pCVar19,(char *)ip4,0x40);
        psVar6 = pCVar19->ai_addr;
        sx->buffer[4] = psVar6->sa_data[2];
        sx->buffer[5] = psVar6->sa_data[3];
        sx->buffer[6] = psVar6->sa_data[4];
        sx->buffer[7] = psVar6->sa_data[5];
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",ip4);
        }
        Curl_resolv_unlink(data,&dns);
        bVar24 = false;
        goto LAB_001598fc;
      }
    }
    pcVar21 = sx->hostname;
    pcVar20 = "SOCKS4 connection to %s not supported";
  }
  Curl_failf(data,pcVar20,pcVar21);
  bVar24 = true;
LAB_001598fc:
  if (bVar24) {
    CVar15 = CURLPX_RESOLVE_HOST;
  }
  else {
switchD_001592ad_caseD_9:
    sx->buffer[8] = '\0';
    pcVar21 = sx->proxy_user;
    if (pcVar21 != (char *)0x0) {
      sVar22 = strlen(pcVar21);
      if (0xff < sVar22) {
        Curl_failf(data,"Too long SOCKS proxy username");
        cf = local_90;
        CVar15 = CURLPX_LONG_USER;
        goto LAB_00159b7b;
      }
      memcpy(sx->buffer + 8,pcVar21,sVar22 + 1);
    }
    sVar22 = strlen((char *)(sx->buffer + 8));
    uVar18 = sVar22 + 9;
    if (uVar3 == '\x06') {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      pcVar21 = sx->hostname;
      sVar22 = strlen(pcVar21);
      if ((sVar22 + 1 < 0x100) && (uVar23 = sVar22 + 1 + uVar18, uVar23 < 600)) {
        strcpy((char *)(puVar1 + uVar18),pcVar21);
        bVar24 = true;
        uVar18 = uVar23;
      }
      else {
        bVar24 = false;
        Curl_failf(data,"SOCKS4: too long hostname");
        in_R8D = CURLPX_LONG_HOSTNAME;
      }
      if (bVar24) goto LAB_00159a1c;
      bVar24 = false;
    }
    else {
LAB_00159a1c:
      sx->outp = puVar1;
      sx->outstanding = uVar18;
      bVar24 = true;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
    }
    cf = local_90;
    CVar15 = in_R8D;
    if (bVar24) {
switchD_001592ad_caseD_e:
      CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
      if (CVar15 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 8;
          sx->outp = puVar1;
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
switchD_001592ad_caseD_4:
          CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
          if (CVar15 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_00159ac4;
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
switchD_001592ad_caseD_2:
            if (*puVar1 == '\0') {
              switch(sx->buffer[1]) {
              case 'Z':
                CVar15 = CURLPX_OK;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (CVar15 = CURLPX_OK, 0 < pcVar7->log_level)))) {
                  pcVar21 = "";
                  if (uVar3 == '\x06') {
                    pcVar21 = "a";
                  }
                  Curl_infof(data,"SOCKS4%s request granted.",pcVar21);
                  goto LAB_00159ac4;
                }
                break;
              case '[':
                Curl_failf(data,
                           "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5b);
                CVar15 = CURLPX_REQUEST_FAILED;
                break;
              case '\\':
                Curl_failf(data,
                           "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5c);
                CVar15 = CURLPX_IDENTD;
                break;
              case ']':
                Curl_failf(data,
                           "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5d);
                CVar15 = CURLPX_IDENTD_DIFFER;
                break;
              default:
                Curl_failf(data,
                           "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                           (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
                CVar15 = CURLPX_UNKNOWN_FAIL;
              }
            }
            else {
              Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
              CVar15 = CURLPX_BAD_VERSION;
            }
          }
        }
        else {
LAB_00159ac4:
          CVar15 = CURLPX_OK;
        }
      }
    }
  }
LAB_00159b7b:
  CVar10 = CURLE_OK;
  goto LAB_0015a5dd;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}